

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O2

void Eigen::internal::
     assign_impl<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_3,_0,_0>
     ::run(Matrix<double,__1,_1,_0,_2,_1> *dst,Matrix<double,__1,_1,_0,_2,_1> *src)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  Index index_1;
  long lVar5;
  long lVar6;
  Index index;
  long lVar7;
  
  lVar3 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_2,_1>_>).m_storage.m_rows;
  lVar5 = lVar3 / 2;
  lVar6 = lVar5 * 2;
  for (lVar7 = 0; SBORROW8(lVar7,lVar6) != lVar7 + lVar5 * -2 < 0; lVar7 = lVar7 + 2) {
    pdVar1 = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_2,_1>_>).m_storage.m_data.
             array + lVar7;
    dVar4 = pdVar1[1];
    pdVar2 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_2,_1>_>).m_storage.m_data.
             array + lVar7;
    *pdVar2 = *pdVar1;
    pdVar2[1] = dVar4;
  }
  for (; lVar6 < lVar3; lVar6 = lVar6 + 1) {
    (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_2,_1>_>).m_storage.m_data.array
    [lVar6] = (src->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_2,_1>_>).m_storage.m_data.
              array[lVar6];
  }
  return;
}

Assistant:

DenseIndex rows(void) const {return m_rows;}